

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# activity_tracking.hpp
# Opt level: O3

activity_stats_t * __thiscall
so_5::stats::activity_tracking_stuff::
stats_collector_t<so_5::stats::activity_tracking_stuff::external_lock<so_5::spinlock_t<so_5::yield_backoff_t>,_so_5::stats::activity_tracking_stuff::default_lock_policy>_>
::take_stats(activity_stats_t *__return_storage_ptr__,
            stats_collector_t<so_5::stats::activity_tracking_stuff::external_lock<so_5::spinlock_t<so_5::yield_backoff_t>,_so_5::stats::activity_tracking_stuff::default_lock_policy>_>
            *this)

{
  __atomic_flag_data_type _Var1;
  spinlock_t<so_5::yield_backoff_t> *psVar2;
  long lVar3;
  ulong uVar4;
  rep rVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  take_stats_lock_t lock;
  
  (__return_storage_ptr__->m_avg_time).__r = 0;
  __return_storage_ptr__->m_count = 0;
  (__return_storage_ptr__->m_total_time).__r = 0;
  psVar2 = (this->
           super_external_lock<so_5::spinlock_t<so_5::yield_backoff_t>,_so_5::stats::activity_tracking_stuff::default_lock_policy>
           ).m_lock;
  while( true ) {
    LOCK();
    _Var1 = (psVar2->m_flag).super___atomic_flag_base._M_i;
    (psVar2->m_flag).super___atomic_flag_base._M_i = true;
    UNLOCK();
    if (_Var1 == false) break;
    sched_yield();
  }
  (__return_storage_ptr__->m_avg_time).__r = (this->m_work_activity).m_avg_time.__r;
  rVar5 = (this->m_work_activity).m_total_time.__r;
  __return_storage_ptr__->m_count = (this->m_work_activity).m_count;
  (__return_storage_ptr__->m_total_time).__r = rVar5;
  if (this->m_is_in_working == true) {
    lVar3 = (this->m_work_started_at).__d.__r;
    (((this->
      super_external_lock<so_5::spinlock_t<so_5::yield_backoff_t>,_so_5::stats::activity_tracking_stuff::default_lock_policy>
      ).m_lock)->m_flag).super___atomic_flag_base._M_i = false;
    lVar6 = std::chrono::_V2::steady_clock::now();
    lVar6 = lVar6 - lVar3;
    (__return_storage_ptr__->m_total_time).__r = (__return_storage_ptr__->m_total_time).__r + lVar6;
    uVar4 = __return_storage_ptr__->m_count;
    iVar8 = 1;
    if (uVar4 != 0) {
      iVar8 = (int)uVar4;
    }
    iVar7 = 100;
    if (uVar4 < 0x65) {
      iVar7 = iVar8;
    }
    (__return_storage_ptr__->m_avg_time).__r =
         (lVar6 + (long)(iVar7 + -1) * (__return_storage_ptr__->m_avg_time).__r) / (long)iVar7;
  }
  else {
    (((this->
      super_external_lock<so_5::spinlock_t<so_5::yield_backoff_t>,_so_5::stats::activity_tracking_stuff::default_lock_policy>
      ).m_lock)->m_flag).super___atomic_flag_base._M_i = false;
  }
  return __return_storage_ptr__;
}

Assistant:

so_5::stats::activity_stats_t
		take_stats()
			{
				so_5::stats::activity_stats_t result;
				bool is_in_working{ false };
				so_5::stats::clock_type_t::time_point work_started_at;

				{
					typename LOCK_HOLDER::take_stats_lock_t lock{ lock_holder() };

					result = m_work_activity;
					if( true == (is_in_working = m_is_in_working) )
						work_started_at = m_work_started_at;
				}

				if( is_in_working )
					so_5::stats::details::update_stats_from_current_time(
							result,
							work_started_at );

				return result;
			}